

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O3

void __thiscall
Centaurus::SkipRoutineEM64T<char>::SkipRoutineEM64T
          (SkipRoutineEM64T<char> *this,CharClass<char> *filter,Logger *logger)

{
  CodeHolder *this_00;
  Label rejectlabel;
  X86Assembler as;
  MyConstPool pool;
  undefined1 auStack_218 [216];
  undefined1 local_140 [40];
  ConstPool local_118;
  undefined1 local_38 [16];
  
  this->_vptr_SkipRoutineEM64T = (_func_int **)&PTR__SkipRoutineEM64T_001bd830;
  asmjit::JitRuntime::JitRuntime(&this->m_runtime);
  this_00 = &this->m_code;
  asmjit::CodeHolder::CodeHolder(this_00);
  asmjit::CodeHolder::init
            (this_00,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (logger != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(this_00,logger);
  }
  asmjit::X86Assembler::X86Assembler((X86Assembler *)(auStack_218 + 0x20),this_00);
  emit_parser_prolog((X86Assembler *)(auStack_218 + 0x20));
  local_140._0_8_ = &DAT_00000032;
  local_140._12_4_ = 4;
  local_140._8_4_ = 0x20;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)(auStack_218 + 0x20),0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),
             (Operand_ *)local_140);
  MyConstPool::MyConstPool((MyConstPool *)local_140,(X86Assembler *)(auStack_218 + 0x20));
  asmjit::Assembler::newLabel((Assembler *)auStack_218);
  auStack_218._16_8_ = 0x110000149;
  auStack_218._24_8_ = 0;
  MyConstPool::load_charclass_filter<char>
            ((MyConstPool *)local_140,(X86Xmm *)(auStack_218 + 0x10),filter);
  emit((X86Assembler *)(auStack_218 + 0x20));
  emit_parser_epilog((X86Assembler *)(auStack_218 + 0x20),(Label *)auStack_218);
  (**(code **)(*(long *)local_140._0_8_ + 0x68))(local_140._0_8_,local_38,&local_118);
  asmjit::CodeEmitter::finalize((CodeEmitter *)(auStack_218 + 0x20));
  asmjit::ConstPool::~ConstPool(&local_118);
  asmjit::Zone::~Zone((Zone *)(local_140 + 8));
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)(auStack_218 + 0x20));
  return;
}

Assistant:

SkipRoutineEM64T<TCHAR>::SkipRoutineEM64T(const CharClass<TCHAR>& filter, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    MyConstPool pool(as);

    asmjit::Label rejectlabel = as.newLabel();

    pool.load_charclass_filter(PATTERN_REG, filter);
    
    emit(as);

    emit_parser_epilog(as, rejectlabel);

    pool.embed();

    as.finalize();
}